

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::extractBits(APInt *this,uint numBits,uint bitPosition)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  APInt *pAVar5;
  byte bVar6;
  uint in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  undefined4 in_register_00000034;
  APInt AVar8;
  uint64_t local_b0;
  anon_union_8_2_1313ab2f_for_U local_a8;
  uint64_t w1;
  uint64_t w0;
  uint word;
  uint64_t *DestPtr;
  uint NumDstWords;
  uint NumSrcWords;
  APInt Result;
  uint hiWord;
  uint loWord;
  uint loBit;
  uint bitPosition_local;
  uint numBits_local;
  APInt *this_local;
  
  pAVar5 = (APInt *)CONCAT44(in_register_00000034,numBits);
  if (bitPosition == 0) {
    __assert_fail("numBits > 0 && \"Can\'t extract zero bits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x194,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  bVar1 = false;
  if ((in_ECX < pAVar5->BitWidth) && (bVar1 = false, bitPosition + in_ECX <= pAVar5->BitWidth)) {
    bVar1 = true;
  }
  if (bVar1) {
    bVar1 = isSingleWord(pAVar5);
    if (bVar1) {
      APInt(this,bitPosition,(pAVar5->U).VAL >> ((byte)in_ECX & 0x3f),false);
      uVar7 = extraout_RDX;
    }
    else {
      uVar2 = whichBit(in_ECX);
      uVar3 = whichWord(in_ECX);
      uVar4 = whichWord((in_ECX + bitPosition) - 1);
      bVar6 = (byte)uVar2;
      if (uVar3 == uVar4) {
        APInt(this,bitPosition,(pAVar5->U).pVal[uVar3] >> (bVar6 & 0x3f),false);
        uVar7 = extraout_RDX_00;
      }
      else if (uVar2 == 0) {
        join_0x00000010_0x00000000_ =
             makeArrayRef<unsigned_long>((pAVar5->U).pVal + uVar3,(ulong)((uVar4 + 1) - uVar3));
        APInt(this,bitPosition,join_0x00000010_0x00000000_);
        uVar7 = extraout_RDX_01;
      }
      else {
        APInt((APInt *)&NumDstWords,bitPosition,0,false);
        uVar2 = getNumWords(pAVar5);
        uVar4 = getNumWords((APInt *)&NumDstWords);
        bVar1 = isSingleWord((APInt *)&NumDstWords);
        if (bVar1) {
          local_a8.pVal = (uint64_t *)&NumDstWords;
        }
        else {
          local_a8 = _NumDstWords;
        }
        for (w0._4_4_ = 0; w0._4_4_ < uVar4; w0._4_4_ = w0._4_4_ + 1) {
          if (uVar3 + w0._4_4_ + 1 < uVar2) {
            local_b0 = (pAVar5->U).pVal[uVar3 + w0._4_4_ + 1];
          }
          else {
            local_b0 = 0;
          }
          local_a8.pVal[w0._4_4_] =
               (pAVar5->U).pVal[uVar3 + w0._4_4_] >> (bVar6 & 0x3f) |
               local_b0 << (0x40 - bVar6 & 0x3f);
        }
        pAVar5 = clearUnusedBits((APInt *)&NumDstWords);
        APInt(this,pAVar5);
        ~APInt((APInt *)&NumDstWords);
        uVar7 = extraout_RDX_02;
      }
    }
    AVar8._8_8_ = uVar7;
    AVar8.U.pVal = (uint64_t *)this;
    return AVar8;
  }
  __assert_fail("bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth && \"Illegal bit extraction\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x196,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
}

Assistant:

APInt APInt::extractBits(unsigned numBits, unsigned bitPosition) const {
  assert(numBits > 0 && "Can't extract zero bits");
  assert(bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth &&
         "Illegal bit extraction");

  if (isSingleWord())
    return APInt(numBits, U.VAL >> bitPosition);

  unsigned loBit = whichBit(bitPosition);
  unsigned loWord = whichWord(bitPosition);
  unsigned hiWord = whichWord(bitPosition + numBits - 1);

  // Single word result extracting bits from a single word source.
  if (loWord == hiWord)
    return APInt(numBits, U.pVal[loWord] >> loBit);

  // Extracting bits that start on a source word boundary can be done
  // as a fast memory copy.
  if (loBit == 0)
    return APInt(numBits, makeArrayRef(U.pVal + loWord, 1 + hiWord - loWord));

  // General case - shift + copy source words directly into place.
  APInt Result(numBits, 0);
  unsigned NumSrcWords = getNumWords();
  unsigned NumDstWords = Result.getNumWords();

  uint64_t *DestPtr = Result.isSingleWord() ? &Result.U.VAL : Result.U.pVal;
  for (unsigned word = 0; word < NumDstWords; ++word) {
    uint64_t w0 = U.pVal[loWord + word];
    uint64_t w1 =
        (loWord + word + 1) < NumSrcWords ? U.pVal[loWord + word + 1] : 0;
    DestPtr[word] = (w0 >> loBit) | (w1 << (APINT_BITS_PER_WORD - loBit));
  }

  return Result.clearUnusedBits();
}